

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionAnalyzer.cpp
# Opt level: O0

bool wasm::ExpressionAnalyzer::isResultUsed(ExpressionStack *stack,Function *func)

{
  If *pIVar1;
  bool bVar2;
  size_t sVar3;
  Expression **ppEVar4;
  BasicType local_5c;
  Type local_58;
  If *local_50;
  If *iff;
  size_t j;
  Block *block;
  Expression *above;
  Expression *curr;
  Function *pFStack_20;
  int i;
  Function *func_local;
  ExpressionStack *stack_local;
  
  pFStack_20 = func;
  func_local = (Function *)stack;
  sVar3 = SmallVector<wasm::Expression_*,_10UL>::size(stack);
  curr._4_4_ = (int)sVar3 + -2;
  do {
    if (curr._4_4_ < 0) {
      local_58 = Function::getResults(pFStack_20);
      local_5c = none;
      bVar2 = wasm::Type::operator!=(&local_58,&local_5c);
      return bVar2;
    }
    ppEVar4 = SmallVector<wasm::Expression_*,_10UL>::operator[]
                        ((SmallVector<wasm::Expression_*,_10UL> *)func_local,(long)curr._4_4_);
    above = *ppEVar4;
    ppEVar4 = SmallVector<wasm::Expression_*,_10UL>::operator[]
                        ((SmallVector<wasm::Expression_*,_10UL> *)func_local,(long)(curr._4_4_ + 1))
    ;
    block = (Block *)*ppEVar4;
    bVar2 = Expression::is<wasm::Block>(above);
    if (bVar2) {
      j = (size_t)Expression::cast<wasm::Block>(above);
      for (iff = (If *)0x0; pIVar1 = iff,
          sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )(j + 0x20)), pIVar1 < (If *)(sVar3 - 1);
          iff = (If *)&(iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.
                       field_0x1) {
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )(j + 0x20),(size_t)iff);
        if ((Block *)*ppEVar4 == block) {
          return false;
        }
      }
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (j + 0x20));
      if ((Block *)*ppEVar4 != block) {
        __assert_fail("block->list.back() == above",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ExpressionAnalyzer.cpp"
                      ,0x2b,
                      "static bool wasm::ExpressionAnalyzer::isResultUsed(ExpressionStack &, Function *)"
                     );
      }
    }
    else {
      bVar2 = Expression::is<wasm::If>(above);
      if (!bVar2) {
        bVar2 = Expression::is<wasm::Drop>(above);
        if (!bVar2) {
          return true;
        }
        return false;
      }
      local_50 = Expression::cast<wasm::If>(above);
      if (block == (Block *)local_50->condition) {
        return true;
      }
      if (local_50->ifFalse == (Expression *)0x0) {
        return false;
      }
      bVar2 = true;
      if (block != (Block *)local_50->ifTrue) {
        bVar2 = block == (Block *)local_50->ifFalse;
      }
      if (!bVar2) {
        __assert_fail("above == iff->ifTrue || above == iff->ifFalse",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ExpressionAnalyzer.cpp"
                      ,0x35,
                      "static bool wasm::ExpressionAnalyzer::isResultUsed(ExpressionStack &, Function *)"
                     );
      }
    }
    curr._4_4_ = curr._4_4_ + -1;
  } while( true );
}

Assistant:

bool ExpressionAnalyzer::isResultUsed(ExpressionStack& stack, Function* func) {
  for (int i = int(stack.size()) - 2; i >= 0; i--) {
    auto* curr = stack[i];
    auto* above = stack[i + 1];
    // only if and block can drop values (pre-drop expression was added) FIXME
    if (curr->is<Block>()) {
      auto* block = curr->cast<Block>();
      for (size_t j = 0; j < block->list.size() - 1; j++) {
        if (block->list[j] == above) {
          return false;
        }
      }
      assert(block->list.back() == above);
      // continue down
    } else if (curr->is<If>()) {
      auto* iff = curr->cast<If>();
      if (above == iff->condition) {
        return true;
      }
      if (!iff->ifFalse) {
        return false;
      }
      assert(above == iff->ifTrue || above == iff->ifFalse);
      // continue down
    } else {
      if (curr->is<Drop>()) {
        return false;
      }
      return true; // all other node types use the result
    }
  }
  // The value might be used, so it depends on if the function returns
  return func->getResults() != Type::none;
}